

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O1

bool google::protobuf::compiler::java::anon_unknown_0::MessageHasConflictingClassName
               (Descriptor *message,string *classname)

{
  size_t sVar1;
  size_t sVar2;
  pointer __s2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long *plVar8;
  Descriptor *message_00;
  
  sVar1 = (*(undefined8 **)message)[1];
  sVar2 = classname->_M_string_length;
  if (sVar1 == sVar2) {
    if (sVar1 == 0) {
      return true;
    }
    iVar5 = bcmp((void *)**(undefined8 **)message,(classname->_M_dataplus)._M_p,sVar1);
    if (iVar5 == 0) {
      return true;
    }
  }
  uVar6 = (ulong)*(int *)(message + 0x48);
  bVar4 = 0 < (long)uVar6;
  if (0 < (long)uVar6) {
    message_00 = *(Descriptor **)(message + 0x50);
    bVar3 = MessageHasConflictingClassName(message_00,classname);
    if (!bVar3) {
      uVar7 = 0;
      do {
        message_00 = message_00 + 0xa8;
        if (uVar6 - 1 == uVar7) goto LAB_0021a681;
        bVar4 = MessageHasConflictingClassName(message_00,classname);
        uVar7 = uVar7 + 1;
      } while (!bVar4);
      bVar4 = uVar7 < uVar6;
    }
    if (bVar4) {
      return true;
    }
  }
LAB_0021a681:
  uVar6 = (ulong)*(int *)(message + 0x58);
  bVar4 = 0 < (long)uVar6;
  if (0 < (long)uVar6) {
    plVar8 = *(long **)(message + 0x60);
    __s2 = (classname->_M_dataplus)._M_p;
    uVar7 = 1;
    do {
      sVar1 = ((undefined8 *)*plVar8)[1];
      if (sVar1 == sVar2) {
        if (sVar1 == 0) {
          return bVar4;
        }
        iVar5 = bcmp(*(void **)*plVar8,__s2,sVar1);
        if (iVar5 == 0) {
          return bVar4;
        }
      }
      bVar4 = uVar7 < uVar6;
      plVar8 = plVar8 + 7;
      bVar3 = uVar7 != uVar6;
      uVar7 = uVar7 + 1;
    } while (bVar3);
  }
  return bVar4;
}

Assistant:

bool MessageHasConflictingClassName(const Descriptor* message,
                                    const string& classname) {
  if (message->name() == classname) return true;
  for (int i = 0; i < message->nested_type_count(); ++i) {
    if (MessageHasConflictingClassName(message->nested_type(i), classname)) {
      return true;
    }
  }
  for (int i = 0; i < message->enum_type_count(); ++i) {
    if (message->enum_type(i)->name() == classname) {
      return true;
    }
  }
  return false;
}